

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O0

void xc_available_functional_numbers_by_name(int *list)

{
  int iVar1;
  void *in_RDI;
  int N;
  int ii;
  int local_c;
  
  iVar1 = xc_number_of_functionals();
  for (local_c = 0; local_c < iVar1; local_c = local_c + 1) {
    *(int *)((long)in_RDI + (long)local_c * 4) = local_c;
  }
  qsort(in_RDI,(long)iVar1,4,compare_func_names);
  for (local_c = 0; local_c < iVar1; local_c = local_c + 1) {
    *(int *)((long)in_RDI + (long)local_c * 4) =
         xc_functional_keys[*(int *)((long)in_RDI + (long)local_c * 4)].number;
  }
  return;
}

Assistant:

void xc_available_functional_numbers_by_name(int *list)
{
  int ii, N;

  /* Arrange list of functional IDs by name */
  N=xc_number_of_functionals();
  for(ii=0;ii<N;ii++) {
    list[ii]=ii;
  }
  qsort(list, N, sizeof(int), compare_func_names);
  /* Map the internal list to functional IDs */
  for(ii=0;ii<N;ii++){
    list[ii]=xc_functional_keys[list[ii]].number;
  }
}